

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

int read_attribute(dwarf_form form,uint64_t implicit_val,dwarf_buf *buf,int is_dwarf64,int version,
                  int addrsize,dwarf_sections *dwarf_sections,dwarf_data *altlink,attr_val *val)

{
  byte bVar1;
  uint16_t uVar2;
  int iVar3;
  uint32_t uVar4;
  char *pcVar5;
  int64_t iVar6;
  uint64_t uVar7;
  anon_union_8_3_08205623_for_u aVar8;
  anon_union_8_3_08205623_for_u aVar9;
  anon_union_8_3_08205623_for_u aVar10;
  anon_union_8_3_08205623_for_u aVar11;
  anon_union_8_3_08205623_for_u aVar12;
  anon_union_8_3_08205623_for_u aVar13;
  anon_union_8_3_08205623_for_u aVar14;
  anon_union_8_3_08205623_for_u aVar15;
  uint64_t offset_4;
  uint64_t offset_3;
  uint64_t offset_2;
  uint64_t form_1;
  uint64_t offset_1;
  uint64_t offset;
  int addrsize_local;
  int version_local;
  int is_dwarf64_local;
  dwarf_buf *buf_local;
  uint64_t implicit_val_local;
  dwarf_form form_local;
  
  *(undefined8 *)val = 0;
  (val->u).uint = 0;
  if (form == DW_FORM_addr) {
    val->encoding = ATTR_VAL_ADDRESS;
    uVar7 = read_address(buf,addrsize);
    (val->u).uint = uVar7;
    return 1;
  }
  if (form == DW_FORM_block2) {
    val->encoding = ATTR_VAL_BLOCK;
    uVar2 = read_uint16(buf);
    iVar3 = advance(buf,(ulong)uVar2);
    return iVar3;
  }
  if (form == DW_FORM_block4) {
    val->encoding = ATTR_VAL_BLOCK;
    uVar4 = read_uint32(buf);
    iVar3 = advance(buf,(ulong)uVar4);
    return iVar3;
  }
  if (form == DW_FORM_data2) {
    val->encoding = ATTR_VAL_UINT;
    uVar2 = read_uint16(buf);
    aVar8.uint._2_6_ = 0;
    aVar8.uint._0_2_ = uVar2;
    val->u = aVar8;
    return 1;
  }
  if (form == DW_FORM_data4) {
    val->encoding = ATTR_VAL_UINT;
    uVar4 = read_uint32(buf);
    aVar9.uint._4_4_ = 0;
    aVar9.uint._0_4_ = uVar4;
    val->u = aVar9;
    return 1;
  }
  if (form == DW_FORM_data8) {
    val->encoding = ATTR_VAL_UINT;
    uVar7 = read_uint64(buf);
    (val->u).uint = uVar7;
    return 1;
  }
  if (form == DW_FORM_string) {
    val->encoding = ATTR_VAL_STRING;
    pcVar5 = read_string(buf);
    (val->u).string = pcVar5;
    return (uint)((val->u).uint != 0);
  }
  if (form == DW_FORM_block) {
    val->encoding = ATTR_VAL_BLOCK;
    uVar7 = read_uleb128(buf);
    iVar3 = advance(buf,uVar7);
    return iVar3;
  }
  if (form == DW_FORM_block1) {
    val->encoding = ATTR_VAL_BLOCK;
    bVar1 = read_byte(buf);
    iVar3 = advance(buf,(ulong)bVar1);
    return iVar3;
  }
  if (form == DW_FORM_data1) {
    val->encoding = ATTR_VAL_UINT;
    bVar1 = read_byte(buf);
    aVar10.uint._1_7_ = 0;
    aVar10.uint._0_1_ = bVar1;
    val->u = aVar10;
    return 1;
  }
  if (form == DW_FORM_flag) {
    val->encoding = ATTR_VAL_UINT;
    bVar1 = read_byte(buf);
    aVar11.uint._1_7_ = 0;
    aVar11.uint._0_1_ = bVar1;
    val->u = aVar11;
    return 1;
  }
  if (form == DW_FORM_sdata) {
    val->encoding = ATTR_VAL_SINT;
    iVar6 = read_sleb128(buf);
    (val->u).sint = iVar6;
    return 1;
  }
  if (form == DW_FORM_strp) {
    uVar7 = read_offset(buf,is_dwarf64);
    if (dwarf_sections->size[4] <= uVar7) {
      dwarf_buf_error(buf,"DW_FORM_strp out of range",0);
      return 0;
    }
    val->encoding = ATTR_VAL_STRING;
    (val->u).string = (char *)(dwarf_sections->data[4] + uVar7);
    return 1;
  }
  if (form == DW_FORM_udata) {
    val->encoding = ATTR_VAL_UINT;
    uVar7 = read_uleb128(buf);
    (val->u).uint = uVar7;
    return 1;
  }
  if (form == DW_FORM_ref_addr) {
    val->encoding = ATTR_VAL_REF_INFO;
    if (version == 2) {
      uVar7 = read_address(buf,addrsize);
      (val->u).uint = uVar7;
    }
    else {
      uVar7 = read_offset(buf,is_dwarf64);
      (val->u).uint = uVar7;
    }
    return 1;
  }
  if (form == DW_FORM_ref1) {
    val->encoding = ATTR_VAL_REF_UNIT;
    bVar1 = read_byte(buf);
    aVar12.uint._1_7_ = 0;
    aVar12.uint._0_1_ = bVar1;
    val->u = aVar12;
    return 1;
  }
  if (form == DW_FORM_ref2) {
    val->encoding = ATTR_VAL_REF_UNIT;
    uVar2 = read_uint16(buf);
    aVar13.uint._2_6_ = 0;
    aVar13.uint._0_2_ = uVar2;
    val->u = aVar13;
    return 1;
  }
  if (form == DW_FORM_ref4) {
    val->encoding = ATTR_VAL_REF_UNIT;
    uVar4 = read_uint32(buf);
    aVar14.uint._4_4_ = 0;
    aVar14.uint._0_4_ = uVar4;
    val->u = aVar14;
    return 1;
  }
  if (form == DW_FORM_ref8) {
    val->encoding = ATTR_VAL_REF_UNIT;
    uVar7 = read_uint64(buf);
    (val->u).uint = uVar7;
    return 1;
  }
  if (form == DW_FORM_ref_udata) {
    val->encoding = ATTR_VAL_REF_UNIT;
    uVar7 = read_uleb128(buf);
    (val->u).uint = uVar7;
    return 1;
  }
  if (form == DW_FORM_indirect) {
    uVar7 = read_uleb128(buf);
    if (uVar7 == 0x21) {
      dwarf_buf_error(buf,"DW_FORM_indirect to DW_FORM_implicit_const",0);
      return 0;
    }
    iVar3 = read_attribute((dwarf_form)uVar7,0,buf,is_dwarf64,version,addrsize,dwarf_sections,
                           altlink,val);
    return iVar3;
  }
  if (form == DW_FORM_sec_offset) {
    val->encoding = ATTR_VAL_REF_SECTION;
    uVar7 = read_offset(buf,is_dwarf64);
    (val->u).uint = uVar7;
    return 1;
  }
  if (form == DW_FORM_exprloc) {
    val->encoding = ATTR_VAL_EXPR;
    uVar7 = read_uleb128(buf);
    iVar3 = advance(buf,uVar7);
    return iVar3;
  }
  if (form == DW_FORM_flag_present) {
    val->encoding = ATTR_VAL_UINT;
    (val->u).uint = 1;
    return 1;
  }
  if (form == DW_FORM_strx) {
code_r0x0015cc24:
    switch(form) {
    case DW_FORM_strx:
      offset_3 = read_uleb128(buf);
      break;
    default:
      return 0;
    case DW_FORM_strx1:
      bVar1 = read_byte(buf);
      offset_3 = (uint64_t)bVar1;
      break;
    case DW_FORM_strx2:
      uVar2 = read_uint16(buf);
      offset_3 = (uint64_t)uVar2;
      break;
    case DW_FORM_strx3:
      uVar4 = read_uint24(buf);
      offset_3 = (uint64_t)uVar4;
      break;
    case DW_FORM_strx4:
      uVar4 = read_uint32(buf);
      offset_3 = (uint64_t)uVar4;
    }
    val->encoding = ATTR_VAL_STRING_INDEX;
    (val->u).uint = offset_3;
    implicit_val_local._4_4_ = 1;
  }
  else {
    if (form == DW_FORM_addrx) {
code_r0x0015ccd2:
      switch(form) {
      case DW_FORM_addrx:
        offset_4 = read_uleb128(buf);
        break;
      default:
        return 0;
      case DW_FORM_addrx1:
        bVar1 = read_byte(buf);
        offset_4 = (uint64_t)bVar1;
        break;
      case DW_FORM_addrx2:
        uVar2 = read_uint16(buf);
        offset_4 = (uint64_t)uVar2;
        break;
      case DW_FORM_addrx3:
        uVar4 = read_uint24(buf);
        offset_4 = (uint64_t)uVar4;
        break;
      case DW_FORM_addrx4:
        uVar4 = read_uint32(buf);
        offset_4 = (uint64_t)uVar4;
      }
      val->encoding = ATTR_VAL_ADDRESS_INDEX;
      (val->u).uint = offset_4;
      return 1;
    }
    if (form == DW_FORM_ref_sup4) {
      val->encoding = ATTR_VAL_REF_SECTION;
      uVar4 = read_uint32(buf);
      aVar15.uint._4_4_ = 0;
      aVar15.uint._0_4_ = uVar4;
      val->u = aVar15;
      return 1;
    }
    if (form != DW_FORM_strp_sup) {
      if (form == DW_FORM_data16) {
        val->encoding = ATTR_VAL_BLOCK;
        iVar3 = advance(buf,0x10);
        return iVar3;
      }
      if (form == DW_FORM_line_strp) {
        uVar7 = read_offset(buf,is_dwarf64);
        if (dwarf_sections->size[7] <= uVar7) {
          dwarf_buf_error(buf,"DW_FORM_line_strp out of range",0);
          return 0;
        }
        val->encoding = ATTR_VAL_STRING;
        (val->u).string = (char *)(dwarf_sections->data[7] + uVar7);
        return 1;
      }
      if (form == DW_FORM_ref_sig8) {
        val->encoding = ATTR_VAL_REF_TYPE;
        uVar7 = read_uint64(buf);
        (val->u).uint = uVar7;
        return 1;
      }
      if (form == DW_FORM_implicit_const) {
        val->encoding = ATTR_VAL_UINT;
        (val->u).uint = implicit_val;
        return 1;
      }
      if (form == DW_FORM_loclistx) {
        val->encoding = ATTR_VAL_REF_SECTION;
        uVar7 = read_uleb128(buf);
        (val->u).uint = uVar7;
        return 1;
      }
      if (form == DW_FORM_rnglistx) {
        val->encoding = ATTR_VAL_RNGLISTS_INDEX;
        uVar7 = read_uleb128(buf);
        (val->u).uint = uVar7;
        return 1;
      }
      if (form == DW_FORM_ref_sup8) {
        val->encoding = ATTR_VAL_REF_SECTION;
        uVar7 = read_uint64(buf);
        (val->u).uint = uVar7;
        return 1;
      }
      if (form - DW_FORM_strx1 < 4) goto code_r0x0015cc24;
      if (form - DW_FORM_addrx1 < 4) goto code_r0x0015ccd2;
      if (form == DW_FORM_GNU_addr_index) {
        val->encoding = ATTR_VAL_REF_SECTION;
        uVar7 = read_uleb128(buf);
        (val->u).uint = uVar7;
        return 1;
      }
      if (form == DW_FORM_GNU_str_index) {
        val->encoding = ATTR_VAL_REF_SECTION;
        uVar7 = read_uleb128(buf);
        (val->u).uint = uVar7;
        return 1;
      }
      if (form == DW_FORM_GNU_ref_alt) {
        uVar7 = read_offset(buf,is_dwarf64);
        (val->u).uint = uVar7;
        if (altlink == (dwarf_data *)0x0) {
          val->encoding = ATTR_VAL_NONE;
          return 1;
        }
        val->encoding = ATTR_VAL_REF_ALT_INFO;
        return 1;
      }
      if (form != DW_FORM_GNU_strp_alt) {
        dwarf_buf_error(buf,"unrecognized DWARF form",-1);
        return 0;
      }
    }
    uVar7 = read_offset(buf,is_dwarf64);
    if (altlink == (dwarf_data *)0x0) {
      val->encoding = ATTR_VAL_NONE;
      implicit_val_local._4_4_ = 1;
    }
    else if (uVar7 < (altlink->dwarf_sections).size[4]) {
      val->encoding = ATTR_VAL_STRING;
      (val->u).string = (char *)((altlink->dwarf_sections).data[4] + uVar7);
      implicit_val_local._4_4_ = 1;
    }
    else {
      dwarf_buf_error(buf,"DW_FORM_strp_sup out of range",0);
      implicit_val_local._4_4_ = 0;
    }
  }
  return implicit_val_local._4_4_;
}

Assistant:

static int
read_attribute (enum dwarf_form form, uint64_t implicit_val,
		struct dwarf_buf *buf, int is_dwarf64, int version,
		int addrsize, const struct dwarf_sections *dwarf_sections,
		struct dwarf_data *altlink, struct attr_val *val)
{
  /* Avoid warnings about val.u.FIELD may be used uninitialized if
     this function is inlined.  The warnings aren't valid but can
     occur because the different fields are set and used
     conditionally.  */
  memset (val, 0, sizeof *val);

  switch (form)
    {
    case DW_FORM_addr:
      val->encoding = ATTR_VAL_ADDRESS;
      val->u.uint = read_address (buf, addrsize);
      return 1;
    case DW_FORM_block2:
      val->encoding = ATTR_VAL_BLOCK;
      return advance (buf, read_uint16 (buf));
    case DW_FORM_block4:
      val->encoding = ATTR_VAL_BLOCK;
      return advance (buf, read_uint32 (buf));
    case DW_FORM_data2:
      val->encoding = ATTR_VAL_UINT;
      val->u.uint = read_uint16 (buf);
      return 1;
    case DW_FORM_data4:
      val->encoding = ATTR_VAL_UINT;
      val->u.uint = read_uint32 (buf);
      return 1;
    case DW_FORM_data8:
      val->encoding = ATTR_VAL_UINT;
      val->u.uint = read_uint64 (buf);
      return 1;
    case DW_FORM_data16:
      val->encoding = ATTR_VAL_BLOCK;
      return advance (buf, 16);
    case DW_FORM_string:
      val->encoding = ATTR_VAL_STRING;
      val->u.string = read_string (buf);
      return val->u.string == NULL ? 0 : 1;
    case DW_FORM_block:
      val->encoding = ATTR_VAL_BLOCK;
      return advance (buf, read_uleb128 (buf));
    case DW_FORM_block1:
      val->encoding = ATTR_VAL_BLOCK;
      return advance (buf, read_byte (buf));
    case DW_FORM_data1:
      val->encoding = ATTR_VAL_UINT;
      val->u.uint = read_byte (buf);
      return 1;
    case DW_FORM_flag:
      val->encoding = ATTR_VAL_UINT;
      val->u.uint = read_byte (buf);
      return 1;
    case DW_FORM_sdata:
      val->encoding = ATTR_VAL_SINT;
      val->u.sint = read_sleb128 (buf);
      return 1;
    case DW_FORM_strp:
      {
	uint64_t offset;

	offset = read_offset (buf, is_dwarf64);
	if (offset >= dwarf_sections->size[DEBUG_STR])
	  {
	    dwarf_buf_error (buf, "DW_FORM_strp out of range", 0);
	    return 0;
	  }
	val->encoding = ATTR_VAL_STRING;
	val->u.string =
	  (const char *) dwarf_sections->data[DEBUG_STR] + offset;
	return 1;
      }
    case DW_FORM_line_strp:
      {
	uint64_t offset;

	offset = read_offset (buf, is_dwarf64);
	if (offset >= dwarf_sections->size[DEBUG_LINE_STR])
	  {
	    dwarf_buf_error (buf, "DW_FORM_line_strp out of range", 0);
	    return 0;
	  }
	val->encoding = ATTR_VAL_STRING;
	val->u.string =
	  (const char *) dwarf_sections->data[DEBUG_LINE_STR] + offset;
	return 1;
      }
    case DW_FORM_udata:
      val->encoding = ATTR_VAL_UINT;
      val->u.uint = read_uleb128 (buf);
      return 1;
    case DW_FORM_ref_addr:
      val->encoding = ATTR_VAL_REF_INFO;
      if (version == 2)
	val->u.uint = read_address (buf, addrsize);
      else
	val->u.uint = read_offset (buf, is_dwarf64);
      return 1;
    case DW_FORM_ref1:
      val->encoding = ATTR_VAL_REF_UNIT;
      val->u.uint = read_byte (buf);
      return 1;
    case DW_FORM_ref2:
      val->encoding = ATTR_VAL_REF_UNIT;
      val->u.uint = read_uint16 (buf);
      return 1;
    case DW_FORM_ref4:
      val->encoding = ATTR_VAL_REF_UNIT;
      val->u.uint = read_uint32 (buf);
      return 1;
    case DW_FORM_ref8:
      val->encoding = ATTR_VAL_REF_UNIT;
      val->u.uint = read_uint64 (buf);
      return 1;
    case DW_FORM_ref_udata:
      val->encoding = ATTR_VAL_REF_UNIT;
      val->u.uint = read_uleb128 (buf);
      return 1;
    case DW_FORM_indirect:
      {
	uint64_t form;

	form = read_uleb128 (buf);
	if (form == DW_FORM_implicit_const)
	  {
	    dwarf_buf_error (buf,
			     "DW_FORM_indirect to DW_FORM_implicit_const",
			     0);
	    return 0;
	  }
	return read_attribute ((enum dwarf_form) form, 0, buf, is_dwarf64,
			       version, addrsize, dwarf_sections, altlink,
			       val);
      }
    case DW_FORM_sec_offset:
      val->encoding = ATTR_VAL_REF_SECTION;
      val->u.uint = read_offset (buf, is_dwarf64);
      return 1;
    case DW_FORM_exprloc:
      val->encoding = ATTR_VAL_EXPR;
      return advance (buf, read_uleb128 (buf));
    case DW_FORM_flag_present:
      val->encoding = ATTR_VAL_UINT;
      val->u.uint = 1;
      return 1;
    case DW_FORM_ref_sig8:
      val->encoding = ATTR_VAL_REF_TYPE;
      val->u.uint = read_uint64 (buf);
      return 1;
    case DW_FORM_strx: case DW_FORM_strx1: case DW_FORM_strx2:
    case DW_FORM_strx3: case DW_FORM_strx4:
      {
	uint64_t offset;

	switch (form)
	  {
	  case DW_FORM_strx:
	    offset = read_uleb128 (buf);
	    break;
	  case DW_FORM_strx1:
	    offset = read_byte (buf);
	    break;
	  case DW_FORM_strx2:
	    offset = read_uint16 (buf);
	    break;
	  case DW_FORM_strx3:
	    offset = read_uint24 (buf);
	    break;
	  case DW_FORM_strx4:
	    offset = read_uint32 (buf);
	    break;
	  default:
	    /* This case can't happen.  */
	    return 0;
	  }
	val->encoding = ATTR_VAL_STRING_INDEX;
	val->u.uint = offset;
	return 1;
      }
    case DW_FORM_addrx: case DW_FORM_addrx1: case DW_FORM_addrx2:
    case DW_FORM_addrx3: case DW_FORM_addrx4:
      {
	uint64_t offset;

	switch (form)
	  {
	  case DW_FORM_addrx:
	    offset = read_uleb128 (buf);
	    break;
	  case DW_FORM_addrx1:
	    offset = read_byte (buf);
	    break;
	  case DW_FORM_addrx2:
	    offset = read_uint16 (buf);
	    break;
	  case DW_FORM_addrx3:
	    offset = read_uint24 (buf);
	    break;
	  case DW_FORM_addrx4:
	    offset = read_uint32 (buf);
	    break;
	  default:
	    /* This case can't happen.  */
	    return 0;
	  }
	val->encoding = ATTR_VAL_ADDRESS_INDEX;
	val->u.uint = offset;
	return 1;
      }
    case DW_FORM_ref_sup4:
      val->encoding = ATTR_VAL_REF_SECTION;
      val->u.uint = read_uint32 (buf);
      return 1;
    case DW_FORM_ref_sup8:
      val->encoding = ATTR_VAL_REF_SECTION;
      val->u.uint = read_uint64 (buf);
      return 1;
    case DW_FORM_implicit_const:
      val->encoding = ATTR_VAL_UINT;
      val->u.uint = implicit_val;
      return 1;
    case DW_FORM_loclistx:
      /* We don't distinguish this from DW_FORM_sec_offset.  It
       * shouldn't matter since we don't care about loclists.  */
      val->encoding = ATTR_VAL_REF_SECTION;
      val->u.uint = read_uleb128 (buf);
      return 1;
    case DW_FORM_rnglistx:
      val->encoding = ATTR_VAL_RNGLISTS_INDEX;
      val->u.uint = read_uleb128 (buf);
      return 1;
    case DW_FORM_GNU_addr_index:
      val->encoding = ATTR_VAL_REF_SECTION;
      val->u.uint = read_uleb128 (buf);
      return 1;
    case DW_FORM_GNU_str_index:
      val->encoding = ATTR_VAL_REF_SECTION;
      val->u.uint = read_uleb128 (buf);
      return 1;
    case DW_FORM_GNU_ref_alt:
      val->u.uint = read_offset (buf, is_dwarf64);
      if (altlink == NULL)
	{
	  val->encoding = ATTR_VAL_NONE;
	  return 1;
	}
      val->encoding = ATTR_VAL_REF_ALT_INFO;
      return 1;
    case DW_FORM_strp_sup: case DW_FORM_GNU_strp_alt:
      {
	uint64_t offset;

	offset = read_offset (buf, is_dwarf64);
	if (altlink == NULL)
	  {
	    val->encoding = ATTR_VAL_NONE;
	    return 1;
	  }
	if (offset >= altlink->dwarf_sections.size[DEBUG_STR])
	  {
	    dwarf_buf_error (buf, "DW_FORM_strp_sup out of range", 0);
	    return 0;
	  }
	val->encoding = ATTR_VAL_STRING;
	val->u.string =
	  (const char *) altlink->dwarf_sections.data[DEBUG_STR] + offset;
	return 1;
      }
    default:
      dwarf_buf_error (buf, "unrecognized DWARF form", -1);
      return 0;
    }
}